

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  string *psVar2;
  uchar value;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ostream *poVar7;
  Message m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string local_58;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  Message::Message((Message *)&local_60);
  if (str->_M_string_length != 0) {
    poVar7 = (ostream *)(local_60._M_head_impl + 0x10);
    uVar4 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar4];
      uVar6 = (uint)bVar1;
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          lVar3 = 6;
          pcVar5 = "&quot;";
          if (is_attribute) goto LAB_0012270f;
          local_58._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
        }
        else {
          if (bVar1 == 0x26) {
            lVar3 = 5;
            pcVar5 = "&amp;";
            goto LAB_0012270f;
          }
LAB_00122729:
          if ((0x1f < bVar1) || ((uVar6 < 0xe && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0)))) {
            if ((is_attribute) && ((uVar6 < 0xe && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"&#x",3);
              String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)uVar6,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                 (byte)local_58._M_dataplus._M_p),
                         local_58._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
                  &local_58.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (byte)local_58._M_dataplus._M_p),
                                local_58.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_58._M_dataplus._M_p._0_1_ = bVar1;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
            }
          }
        }
      }
      else {
        if (bVar1 == 0x27) {
          lVar3 = 6;
          pcVar5 = "&apos;";
          if (!is_attribute) {
            local_58._M_dataplus._M_p._0_1_ = 0x27;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
            goto LAB_00122717;
          }
        }
        else {
          lVar3 = 4;
          if (uVar6 == 0x3e) {
            pcVar5 = "&gt;";
          }
          else {
            if (uVar6 != 0x3c) goto LAB_00122729;
            pcVar5 = "&lt;";
          }
        }
LAB_0012270f:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,lVar3);
      }
LAB_00122717:
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  psVar2 = local_38;
  StringStreamToString(local_38,local_60._M_head_impl);
  if (local_60._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))(local_60._M_head_impl);
  }
  return psVar2;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(const std::string& str,
                                                bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(static_cast<unsigned char>(ch))) {
          if (is_attribute &&
              IsNormalizableWhitespace(static_cast<unsigned char>(ch)))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}